

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void kj::Arena::
     destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
               (void *pointer)

{
  int *piVar1;
  
  if (*pointer == '\x01') {
    piVar1 = *(int **)((long)pointer + 8);
    *(undefined1 *)pointer = 0;
    if ((char)piVar1[0x24] == '\x01') {
      *(undefined1 *)(piVar1 + 0x24) = 0;
    }
    if (1 < *piVar1) {
      *piVar1 = 1;
    }
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }